

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-math.c
# Opt level: O1

void ft_trig_pseudo_rotate(PVG_FT_Vector *vec,PVG_FT_Angle theta)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  PVG_FT_Angle PVar6;
  PVG_FT_Fixed *pPVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  
  lVar3 = vec->x;
  lVar5 = vec->y;
  lVar8 = lVar3;
  PVar6 = theta;
  if (theta < -0x2d0000) {
    do {
      lVar3 = lVar5;
      lVar5 = -lVar8;
      theta = PVar6 + 0x5a0000;
      bVar2 = PVar6 < -0x870000;
      lVar8 = lVar3;
      PVar6 = theta;
    } while (bVar2);
  }
  lVar8 = lVar5;
  lVar4 = theta;
  if (0x2d0000 < theta) {
    do {
      lVar5 = lVar3;
      lVar3 = -lVar8;
      theta = lVar4 + -0x5a0000;
      bVar2 = 0x870000 < lVar4;
      lVar8 = lVar5;
      lVar4 = theta;
    } while (bVar2);
  }
  pPVar7 = ft_trig_arctan_table;
  lVar4 = 1;
  lVar8 = 1;
  do {
    lVar9 = lVar8 + lVar5 >> ((byte)lVar4 & 0x3f);
    lVar10 = lVar8 + lVar3 >> ((byte)lVar4 & 0x3f);
    lVar1 = *pPVar7;
    if (theta < 0) {
      lVar10 = -lVar10;
    }
    else {
      lVar9 = -lVar9;
      lVar1 = -lVar1;
    }
    theta = theta + lVar1;
    lVar5 = lVar5 + lVar10;
    lVar3 = lVar3 + lVar9;
    pPVar7 = pPVar7 + 1;
    lVar8 = lVar8 * 2;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x17);
  vec->x = lVar3;
  vec->y = lVar5;
  return;
}

Assistant:

static void ft_trig_pseudo_rotate(PVG_FT_Vector* vec, PVG_FT_Angle theta)
{
    PVG_FT_Int          i;
    PVG_FT_Fixed        x, y, xtemp, b;
    const PVG_FT_Fixed* arctanptr;

    x = vec->x;
    y = vec->y;

    /* Rotate inside [-PI/4,PI/4] sector */
    while (theta < -PVG_FT_ANGLE_PI4) {
        xtemp = y;
        y = -x;
        x = xtemp;
        theta += PVG_FT_ANGLE_PI2;
    }

    while (theta > PVG_FT_ANGLE_PI4) {
        xtemp = -y;
        y = x;
        x = xtemp;
        theta -= PVG_FT_ANGLE_PI2;
    }

    arctanptr = ft_trig_arctan_table;

    /* Pseudorotations, with right shifts */
    for (i = 1, b = 1; i < PVG_FT_TRIG_MAX_ITERS; b <<= 1, i++) {
        PVG_FT_Fixed v1 = ((y + b) >> i);
        PVG_FT_Fixed v2 = ((x + b) >> i);
        if (theta < 0) {
            xtemp = x + v1;
            y = y - v2;
            x = xtemp;
            theta += *arctanptr++;
        } else {
            xtemp = x - v1;
            y = y + v2;
            x = xtemp;
            theta -= *arctanptr++;
        }
    }

    vec->x = x;
    vec->y = y;
}